

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

ostream * __thiscall
wasm::ValidationInfo::fail<wasm::StringConst*,std::__cxx11::string>
          (ValidationInfo *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text,StringConst *curr,
          Function *func)

{
  ostringstream *stream_00;
  ostream *poVar1;
  ostringstream *ret;
  ostringstream *stream;
  Function *func_local;
  StringConst *curr_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text_local;
  ValidationInfo *this_local;
  
  std::atomic<bool>::store(&this->valid,false,memory_order_seq_cst);
  this_local = (ValidationInfo *)getStream_abi_cxx11_(this,func);
  if ((this->quiet & 1U) == 0) {
    stream_00 = printFailureHeader_abi_cxx11_(this,func);
    poVar1 = std::operator<<((ostream *)stream_00,(string *)text);
    std::operator<<(poVar1,", on \n");
    this_local = (ValidationInfo *)printModuleComponent((Expression *)curr,stream_00,this->wasm);
  }
  return (ostream *)this_local;
}

Assistant:

std::ostream& fail(S text, T curr, Function* func) {
    valid.store(false);
    auto& stream = getStream(func);
    if (quiet) {
      return stream;
    }
    auto& ret = printFailureHeader(func);
    ret << text << ", on \n";
    return printModuleComponent(curr, ret, wasm);
  }